

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::build(Heap<Gluco::Solver::VarOrderLt> *this,vec<int> *ns)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  long lVar5;
  
  piVar1 = (this->heap).data;
  piVar2 = (this->indices).data;
  for (lVar3 = 0; lVar3 < (this->heap).sz; lVar3 = lVar3 + 1) {
    piVar2[piVar1[lVar3]] = -1;
  }
  if (piVar1 != (int *)0x0) {
    (this->heap).sz = 0;
  }
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < ns->sz; lVar5 = lVar5 + 1) {
    piVar1 = ns->data;
    (this->indices).data[*(int *)((long)piVar1 + lVar3)] = (int)lVar5;
    vec<int>::push(&this->heap,(int *)((long)piVar1 + lVar3));
    lVar3 = lVar3 + 4;
  }
  uVar4 = (long)(this->heap).sz / 2 & 0xffffffff;
  while (0 < (int)uVar4) {
    i = (int)uVar4 - 1;
    percolateDown(this,i);
    uVar4 = (ulong)i;
  }
  return;
}

Assistant:

void build(vec<int>& ns) {
        int i;
        for (i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (i = 0; i < ns.size(); i++){
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }